

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::CloneMap
          (DeserializationCloner<Js::StreamReader> *this,Src src,Dst dst)

{
  scaposition_t sVar1;
  Engine *pEVar2;
  Var local_40;
  Var value;
  Var key;
  int i;
  int32 size;
  JavascriptMap *map;
  Dst dst_local;
  DeserializationCloner<Js::StreamReader> *pDStack_10;
  Src src_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  map = (JavascriptMap *)dst;
  dst_local._4_4_ = src;
  pDStack_10 = this;
  _i = VarTo<Js::JavascriptMap>(dst);
  StreamReader::Read<int>(this->m_reader,(int *)((long)&key + 4));
  key._0_4_ = 0;
  while( true ) {
    if (key._4_4_ <= (int)key) {
      return;
    }
    pEVar2 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
             ::GetEngine(&this->
                          super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                        );
    sVar1 = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (pEVar2,sVar1,&value);
    if (value == (Var)0x0) break;
    pEVar2 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
             ::GetEngine(&this->
                          super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                        );
    sVar1 = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (pEVar2,sVar1,&local_40);
    if (local_40 == (Var)0x0) {
      ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
    }
    JavascriptMap::Set(_i,value,local_40);
    key._0_4_ = (int)key + 1;
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void DeserializationCloner<Reader>::CloneMap(Src src, Dst dst)
    {
        JavascriptMap* map = VarTo<JavascriptMap>(dst);

        int32 size;
        m_reader->Read(&size);

        for (int i = 0; i < size; i++)
        {
            Var key;
            Var value;

            this->GetEngine()->Clone(m_reader->GetPosition(), &key);
            if (!key)
            {
                this->ThrowSCADataCorrupt();
            }

            this->GetEngine()->Clone(m_reader->GetPosition(), &value);
            if (!value)
            {
                this->ThrowSCADataCorrupt();
            }

            map->Set(key, value);
        }
    }